

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.h
# Opt level: O0

void idx2::Reverse<idx2::grid*>(grid *Beg,grid *End)

{
  u64 uVar1;
  u64 uVar2;
  u64 uVar3;
  grid *local_50;
  grid *It2;
  grid *It1;
  grid *End_local;
  grid *Beg_local;
  grid T;
  
  local_50 = End + -1;
  for (It2 = Beg; It2 < local_50; It2 = It2 + 1) {
    uVar1 = (It2->super_extent).From;
    uVar2 = (It2->super_extent).Dims;
    uVar3 = It2->Strd;
    (It2->super_extent).From = (local_50->super_extent).From;
    (It2->super_extent).Dims = (local_50->super_extent).Dims;
    It2->Strd = local_50->Strd;
    (local_50->super_extent).From = uVar1;
    (local_50->super_extent).Dims = uVar2;
    local_50->Strd = uVar3;
    local_50 = local_50 + -1;
  }
  return;
}

Assistant:

void
Reverse(i Beg, i End)
{
  auto It1 = Beg;
  auto It2 = End - 1;
  while (It1 < It2)
  {
    Swap(It1, It2);
    ++It1;
    --It2;
  }
}